

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::Util::EncodeBase64_abi_cxx11_
          (string *__return_storage_ptr__,Util *this,char *data,size_t length)

{
  undefined1 *puVar1;
  ulong __n;
  ulong local_80;
  size_t i;
  size_t iEncodedByte_1;
  char *pcStack_68;
  char finalBytes [4];
  char *currData;
  size_t iEncodedByte;
  size_t iByte;
  size_t ib3;
  allocator<char> local_32;
  undefined1 local_31;
  ulong local_30;
  size_t encodedBytes;
  size_t extraBytes;
  size_t length_local;
  char *data_local;
  string *encoded_string;
  
  encodedBytes = (ulong)data % 3 ^ 3;
  __n = (ulong)((long)(data + encodedBytes) * 4) / 3;
  local_31 = 0;
  local_30 = __n;
  extraBytes = (size_t)data;
  length_local = (size_t)this;
  data_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__n,'=',&local_32);
  std::allocator<char>::~allocator(&local_32);
  for (iByte = 0; iByte < extraBytes / 3; iByte = iByte + 1) {
    pcStack_68 = (char *)(length_local + iByte * 3);
    EncodeByteBlock(pcStack_68,__return_storage_ptr__,iByte << 2);
  }
  if (encodedBytes != 0) {
    iEncodedByte_1._4_4_ = 0;
    memcpy((char *)((long)&iEncodedByte_1 + 4),(void *)(length_local + (extraBytes / 3) * 3),
           extraBytes % 3);
    EncodeByteBlock((char *)((long)&iEncodedByte_1 + 4),__return_storage_ptr__,local_30 - 4);
    for (local_80 = 0; local_80 < (encodedBytes << 2) / 3; local_80 = local_80 + 1) {
      puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar1 = 0x3d;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase64(const char* data, size_t length)
{
    // calculate extra bytes needed to get a multiple of 3
    size_t extraBytes = 3 - length % 3;

    // number of base64 bytes
    size_t encodedBytes = 4 * (length + extraBytes) / 3;

    std::string encoded_string(encodedBytes, '=');

    // read blocks of 3 bytes
    for (size_t ib3 = 0; ib3 < length / 3; ib3++)
    {
        const size_t iByte = ib3 * 3;
        const size_t iEncodedByte = ib3 * 4;
        const char* currData = &data[iByte];

        EncodeByteBlock(currData, encoded_string, iEncodedByte);
    }

    // if size of data is not a multiple of 3, also encode the final bytes (and add zeros where needed)
    if (extraBytes > 0)
    {
        char finalBytes[4] = { 0,0,0,0 };
        memcpy(&finalBytes[0], &data[length - length % 3], length % 3);

        const size_t iEncodedByte = encodedBytes - 4;
        EncodeByteBlock(&finalBytes[0], encoded_string, iEncodedByte);

        // add '=' at the end
        for (size_t i = 0; i < 4 * extraBytes / 3; i++)
            encoded_string[encodedBytes - i - 1] = '=';
    }
    return encoded_string;
}